

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlRegisterInputCallback(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  PyObject *local_28;
  PyObject *cb;
  PyObject *args_local;
  PyObject *self_local;
  
  cb = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:libxml_xmlRegisterInputCallback",&local_28);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = PyCallable_Check(local_28);
    if (iVar1 == 0) {
      PyErr_SetString(_PyExc_ValueError,"input callback is not callable");
      self_local = (PyObject *)0x0;
    }
    else {
      if (pythonInputCallbackID == -1) {
        pythonInputCallbackID =
             xmlRegisterInputCallbacks
                       (pythonInputMatchCallback,pythonInputOpenCallback,xmlPythonFileReadRaw,
                        xmlPythonFileCloseRaw);
        if (pythonInputCallbackID == -1) {
          pPVar2 = (PyObject *)PyErr_NoMemory();
          return pPVar2;
        }
        pythonInputOpenCallbackObject = local_28;
        _Py_INCREF(local_28);
      }
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlRegisterInputCallback(ATTRIBUTE_UNUSED PyObject *self,
                                PyObject *args) {
    PyObject *cb;

    if (!PyArg_ParseTuple(args,
		(const char *)"O:libxml_xmlRegisterInputCallback", &cb))
	return(NULL);

    if (!PyCallable_Check(cb)) {
	PyErr_SetString(PyExc_ValueError, "input callback is not callable");
	return(NULL);
    }

    /* Python module registers a single callback and manages the list of
     * all callbacks internally. This is necessitated by xmlInputMatchCallback
     * API, which does not allow for passing of data objects to discriminate
     * different Python methods.  */
    if (pythonInputCallbackID == -1) {
	pythonInputCallbackID = xmlRegisterInputCallbacks(
		pythonInputMatchCallback, pythonInputOpenCallback,
		xmlPythonFileReadRaw, xmlPythonFileCloseRaw);
	if (pythonInputCallbackID == -1)
	    return PyErr_NoMemory();
	pythonInputOpenCallbackObject = cb;
	Py_INCREF(pythonInputOpenCallbackObject);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}